

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

int poly_unmarshal(poly *out,uint8_t *in)

{
  short sVar1;
  ulong local_40;
  size_t i_2;
  uint32_t sum;
  uint i_1;
  size_t i;
  uint16_t *p;
  uint8_t *in_local;
  poly *out_local;
  
  i = (size_t)out;
  p = (uint16_t *)in;
  for (_sum = 0; _sum < 0x57; _sum = _sum + 1) {
    *(ushort *)i = (ushort)(byte)*p | (*(byte *)((long)p + 1) & 0x1f) << 8;
    *(ushort *)(i + 2) =
         (ushort)((int)(uint)*(byte *)((long)p + 1) >> 5) | (ushort)(byte)p[1] << 3 |
         (*(byte *)((long)p + 3) & 3) << 0xb;
    *(ushort *)(i + 4) = (ushort)((int)(uint)*(byte *)((long)p + 3) >> 2) | ((byte)p[2] & 0x7f) << 6
    ;
    *(ushort *)(i + 6) =
         (ushort)((int)(uint)(byte)p[2] >> 7) | (ushort)*(byte *)((long)p + 5) << 1 |
         ((byte)p[3] & 0xf) << 9;
    *(ushort *)(i + 8) =
         (ushort)((int)(uint)(byte)p[3] >> 4) | (ushort)*(byte *)((long)p + 7) << 4 |
         ((byte)p[4] & 1) << 0xc;
    *(ushort *)(i + 10) =
         (ushort)((int)(uint)(byte)p[4] >> 1) | (*(byte *)((long)p + 9) & 0x3f) << 7;
    *(ushort *)(i + 0xc) =
         (ushort)((int)(uint)*(byte *)((long)p + 9) >> 6) | (ushort)(byte)p[5] << 2 |
         (*(byte *)((long)p + 0xb) & 7) << 10;
    *(ushort *)(i + 0xe) =
         (ushort)((int)(uint)*(byte *)((long)p + 0xb) >> 3) | (ushort)(byte)p[6] << 5;
    i = i + 0x10;
    p = (uint16_t *)((long)p + 0xd);
  }
  *(ushort *)i = (ushort)(byte)*p | (*(byte *)((long)p + 1) & 0x1f) << 8;
  *(ushort *)(i + 2) =
       (ushort)((int)(uint)*(byte *)((long)p + 1) >> 5) | (ushort)(byte)p[1] << 3 |
       (*(byte *)((long)p + 3) & 3) << 0xb;
  *(ushort *)(i + 4) = (ushort)((int)(uint)*(byte *)((long)p + 3) >> 2) | ((byte)p[2] & 0x7f) << 6;
  *(ushort *)(i + 6) =
       (ushort)((int)(uint)(byte)p[2] >> 7) | (ushort)*(byte *)((long)p + 5) << 1 |
       ((byte)p[3] & 0xf) << 9;
  for (i_2._4_4_ = 0; i_2._4_4_ < 700; i_2._4_4_ = i_2._4_4_ + 1) {
    (out->field_0).v[i_2._4_4_] = (short)((out->field_0).v[i_2._4_4_] << 3) >> 3;
  }
  if ((p[3] & 0xf0) == 0) {
    sVar1 = 0;
    for (local_40 = 0; local_40 < 700; local_40 = local_40 + 1) {
      sVar1 = (out->field_0).v[local_40] + sVar1;
    }
    (out->field_0).v[700] = -sVar1;
    poly_normalize(out);
    out_local._4_4_ = 1;
  }
  else {
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

static int poly_unmarshal(struct poly *out, const uint8_t in[POLY_BYTES]) {
  uint16_t *p = out->v;

  for (size_t i = 0; i < N / 8; i++) {
    p[0] = (uint16_t)(in[0]) | (uint16_t)(in[1] & 0x1f) << 8;
    p[1] = (uint16_t)(in[1] >> 5) | (uint16_t)(in[2]) << 3 |
           (uint16_t)(in[3] & 3) << 11;
    p[2] = (uint16_t)(in[3] >> 2) | (uint16_t)(in[4] & 0x7f) << 6;
    p[3] = (uint16_t)(in[4] >> 7) | (uint16_t)(in[5]) << 1 |
           (uint16_t)(in[6] & 0xf) << 9;
    p[4] = (uint16_t)(in[6] >> 4) | (uint16_t)(in[7]) << 4 |
           (uint16_t)(in[8] & 1) << 12;
    p[5] = (uint16_t)(in[8] >> 1) | (uint16_t)(in[9] & 0x3f) << 7;
    p[6] = (uint16_t)(in[9] >> 6) | (uint16_t)(in[10]) << 2 |
           (uint16_t)(in[11] & 7) << 10;
    p[7] = (uint16_t)(in[11] >> 3) | (uint16_t)(in[12]) << 5;

    p += 8;
    in += 13;
  }

  // There are four coefficients remaining.
  p[0] = (uint16_t)(in[0]) | (uint16_t)(in[1] & 0x1f) << 8;
  p[1] = (uint16_t)(in[1] >> 5) | (uint16_t)(in[2]) << 3 |
         (uint16_t)(in[3] & 3) << 11;
  p[2] = (uint16_t)(in[3] >> 2) | (uint16_t)(in[4] & 0x7f) << 6;
  p[3] = (uint16_t)(in[4] >> 7) | (uint16_t)(in[5]) << 1 |
         (uint16_t)(in[6] & 0xf) << 9;

  for (unsigned i = 0; i < N - 1; i++) {
    out->v[i] = (int16_t)(out->v[i] << 3) >> 3;
  }

  // There are four unused bits in the last byte. We require them to be zero.
  if ((in[6] & 0xf0) != 0) {
    return 0;
  }

  // Set the final coefficient as specifed in [HRSSNIST] 1.9.2 step 6.
  uint32_t sum = 0;
  for (size_t i = 0; i < N - 1; i++) {
    sum += out->v[i];
  }

  out->v[N - 1] = (uint16_t)(0u - sum);
  poly_normalize(out);

  return 1;
}